

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::StreamingListener::UrlEncode_abi_cxx11_
          (string *__return_storage_ptr__,StreamingListener *this,char *str)

{
  byte __c;
  size_type __n;
  size_t sVar1;
  String *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar4;
  size_type *local_70;
  size_type local_60;
  undefined8 uStack_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = strlen((char *)this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,sVar1 + 1);
  uVar4 = extraout_RDX;
  do {
    __c = *(byte *)&(this->super_EmptyTestEventListener).super_TestEventListener.
                    _vptr_TestEventListener;
    this_00 = (String *)(ulong)__c;
    if (this_00 < (String *)0x3e) {
      if ((0x2000006000000400U >> ((ulong)this_00 & 0x3f) & 1) == 0) {
        if (this_00 == (String *)0x0) {
          return __return_storage_ptr__;
        }
        goto LAB_00146ff3;
      }
      String::FormatByte_abi_cxx11_(&local_50,this_00,(uchar)uVar4);
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_50,0,0,"%",1);
      local_70 = (size_type *)(pbVar2->_M_dataplus)._M_p;
      paVar3 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70 == paVar3) {
        local_60 = paVar3->_M_allocated_capacity;
        uStack_58 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_70 = &local_60;
      }
      else {
        local_60 = paVar3->_M_allocated_capacity;
      }
      __n = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(char *)local_70,__n);
      uVar4 = extraout_RDX_00;
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
        uVar4 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        uVar4 = extraout_RDX_02;
      }
    }
    else {
LAB_00146ff3:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
      uVar4 = extraout_RDX_03;
    }
    this = (StreamingListener *)
           ((long)&(this->super_EmptyTestEventListener).super_TestEventListener.
                   _vptr_TestEventListener + 1);
  } while( true );
}

Assistant:

std::string StreamingListener::UrlEncode(const char* str) {
  std::string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.append("%" + String::FormatByte(static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}